

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish.cpp
# Opt level: O0

int __thiscall ncnn::HardSwish::forward_inplace(HardSwish *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long *in_RSI;
  long lVar5;
  long in_RDI;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  Mat *m;
  int local_158;
  int local_f4;
  
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar3 = in_RSI[6];
  lVar4 = in_RSI[7];
  for (local_f4 = 0; local_f4 < (int)lVar4; local_f4 = local_f4 + 1) {
    lVar5 = *in_RSI + in_RSI[8] * (long)local_f4 * in_RSI[2];
    for (local_158 = 0; local_158 < iVar2 * (int)lVar3; local_158 = local_158 + 1) {
      if (*(float *)(in_RDI + 0xd8) <= *(float *)(lVar5 + (long)local_158 * 4)) {
        fVar1 = *(float *)(lVar5 + (long)local_158 * 4);
        if (fVar1 < *(float *)(in_RDI + 0xdc) || fVar1 == *(float *)(in_RDI + 0xdc)) {
          *(float *)(lVar5 + (long)local_158 * 4) =
               *(float *)(lVar5 + (long)local_158 * 4) *
               (*(float *)(lVar5 + (long)local_158 * 4) * *(float *)(in_RDI + 0xd0) +
               *(float *)(in_RDI + 0xd4));
        }
      }
      else {
        *(undefined4 *)(lVar5 + (long)local_158 * 4) = 0;
      }
    }
  }
  return 0;
}

Assistant:

int HardSwish::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            if (ptr[i] < lower)
                ptr[i] = 0.f;
            else if (ptr[i] > upper)
                ;
            else
                ptr[i] = ptr[i] * (ptr[i] * alpha + beta);
        }
    }

    return 0;
}